

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool __thiscall
cmCacheManager::LoadCache
          (cmCacheManager *this,string *path,bool internal,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *excludes,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includes)

{
  CacheEntryMap *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  iterator iVar9;
  mapped_type *pmVar10;
  const_iterator cVar11;
  ostream *poVar12;
  undefined1 uVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  _Base_ptr p_Var15;
  cmCacheManager *pcVar16;
  string helpString;
  CacheEntry e;
  string entryKey;
  string cacheFile;
  string buffer;
  ostringstream error;
  ifstream fin;
  string local_4f0;
  string local_4d0;
  cmCacheManager *local_4b0;
  uint local_4a4;
  CacheEntry local_4a0;
  string local_440;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_420;
  string *local_418;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_410;
  undefined1 local_408 [40];
  _Base_ptr local_3e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  CacheEntryMap *local_3c8;
  _Base_ptr local_3c0;
  _Base_ptr local_3b8;
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  local_408._0_8_ = local_408 + 0x10;
  pcVar3 = (path->_M_dataplus)._M_p;
  local_410 = &excludes->_M_t;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_408,pcVar3,pcVar3 + path->_M_string_length);
  std::__cxx11::string::append((char *)local_408);
  if (internal) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
    ::clear(&(this->Cache)._M_t);
  }
  pcVar16 = (cmCacheManager *)local_408;
  bVar5 = cmsys::SystemTools::FileExists((string *)pcVar16);
  if (bVar5) {
    std::ifstream::ifstream(local_238,(char *)local_408._0_8_,_S_in);
    bVar5 = (abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0;
    uVar7 = CONCAT71((int7)((ulong)local_408 >> 8),bVar5);
    if (bVar5) {
      local_4a4 = (uint)uVar7;
      local_408._32_8_ = &local_3d8;
      local_3e0 = (_Base_ptr)0x0;
      local_3d8._M_local_buf[0] = '\0';
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      local_440._M_string_length = 0;
      local_440.field_2._M_local_buf[0] = '\0';
      local_4b0 = this;
      local_420 = &includes->_M_t;
      local_418 = path;
      if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) {
        local_3b8 = &(((_Rep_type *)&local_410->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
        local_3c0 = &(includes->_M_t)._M_impl.super__Rb_tree_header._M_header;
        local_3c8 = &this->Cache;
LAB_0025fd0d:
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        local_4f0._M_string_length = 0;
        local_4f0.field_2._M_local_buf[0] = '\0';
        local_4a0.Value._M_dataplus._M_p = (pointer)&local_4a0.Value.field_2;
        local_4a0.Value._M_string_length = 0;
        local_4a0.Value.field_2._M_local_buf[0] = '\0';
        local_4a0.Type = UNINITIALIZED;
        local_4a0.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_4a0.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_4a0.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_4a0.Properties.
              super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
              ._M_t._M_impl.super__Rb_tree_header._M_header;
        local_4a0.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_4a0.Initialized = false;
        local_4a0.Properties.
        super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_4a0.Properties.
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        cmsys::SystemTools::GetLineFromStream
                  ((istream *)local_238,(string *)(local_408 + 0x20),(bool *)0x0,-1);
        for (paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_408._32_8_; uVar7 = (ulong)(byte)paVar14->_M_local_buf[0],
            uVar7 < 0x30;
            paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)((long)paVar14 + 1)) {
          if ((0x100002600U >> (uVar7 & 0x3f) & 1) == 0) {
            if ((0x800000001U >> (uVar7 & 0x3f) & 1) != 0) goto LAB_0026019e;
            if (uVar7 == 0x2f) goto LAB_0025fddc;
            break;
          }
        }
        goto LAB_0025fe42;
      }
LAB_002601fd:
      pcVar16 = local_4b0;
      local_4b0->CacheMajorVersion = 0;
      local_4b0->CacheMinorVersion = 0;
      pcVar3 = local_3b0 + 0x10;
      local_3b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3b0,"CMAKE_CACHE_MAJOR_VERSION","");
      this_00 = &pcVar16->Cache;
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
               ::find(&this_00->_M_t,(key_type *)local_3b0);
      p_Var1 = &(pcVar16->Cache)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
        p_Var15 = (_Base_ptr)0x0;
      }
      else {
        p_Var15 = (_Base_ptr)0x0;
        if (*(char *)&cVar11._M_node[4]._M_right != '\0') {
          p_Var15 = cVar11._M_node + 2;
        }
      }
      if ((pointer)local_3b0._0_8_ != pcVar3) {
        operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
      }
      if (p_Var15 == (_Base_ptr)0x0) {
        local_3b0._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3b0,"CMAKE_CACHE_MINOR_VERSION","");
        AddCacheEntry(pcVar16,(string *)local_3b0,"0",
                      "Minor version of cmake used to create the current loaded cache",INTERNAL);
        if ((pointer)local_3b0._0_8_ != pcVar3) {
          operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
        }
        local_3b0._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3b0,"CMAKE_CACHE_MAJOR_VERSION","");
        AddCacheEntry(pcVar16,(string *)local_3b0,"0",
                      "Major version of cmake used to create the current loaded cache",INTERNAL);
        if ((pointer)local_3b0._0_8_ != pcVar3) {
          operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
        }
      }
      else {
        local_4a0.Value._M_dataplus._M_p = local_4a0.Value._M_dataplus._M_p & 0xffffffff00000000;
        iVar6 = __isoc99_sscanf(*(undefined8 *)p_Var15,"%u");
        if (iVar6 == 1) {
          pcVar16->CacheMajorVersion = (uint)local_4a0.Value._M_dataplus._M_p;
        }
        local_3b0._0_8_ = pcVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_3b0,"CMAKE_CACHE_MINOR_VERSION","");
        cVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                 ::find(&this_00->_M_t,(key_type *)local_3b0);
        if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
          p_Var15 = (_Base_ptr)0x0;
        }
        else {
          p_Var15 = (_Base_ptr)0x0;
          if (*(char *)&cVar11._M_node[4]._M_right != '\0') {
            p_Var15 = cVar11._M_node + 2;
          }
        }
        if ((pointer)local_3b0._0_8_ != pcVar3) {
          operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
        }
        if ((p_Var15 != (_Base_ptr)0x0) &&
           (iVar6 = __isoc99_sscanf(*(undefined8 *)p_Var15,"%u",&local_4a0), iVar6 == 1)) {
          pcVar16->CacheMinorVersion = (uint)local_4a0.Value._M_dataplus._M_p;
        }
      }
      local_3b0._0_8_ = pcVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"CMAKE_CACHEFILE_DIR","");
      cVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
               ::find(&this_00->_M_t,(key_type *)local_3b0);
      if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
        p_Var15 = (_Base_ptr)0x0;
      }
      else {
        p_Var15 = (_Base_ptr)0x0;
        if (*(char *)&cVar11._M_node[4]._M_right != '\0') {
          p_Var15 = cVar11._M_node + 2;
        }
      }
      if ((pointer)local_3b0._0_8_ != pcVar3) {
        operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
      }
      if (internal && p_Var15 != (_Base_ptr)0x0) {
        paVar14 = &local_4a0.Value.field_2;
        pcVar4 = (local_418->_M_dataplus)._M_p;
        local_4a0.Value._M_dataplus._M_p = (pointer)paVar14;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4a0,pcVar4,pcVar4 + local_418->_M_string_length);
        local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4f0,*(long *)p_Var15,
                   (long)&p_Var15->_M_parent->_M_color + *(long *)p_Var15);
        cmsys::SystemTools::ConvertToUnixSlashes(&local_4a0.Value);
        std::__cxx11::string::append((char *)&local_4a0);
        std::__cxx11::string::append((char *)&local_4f0);
        bVar5 = cmsys::SystemTools::SameFile(&local_4f0,&local_4a0.Value);
        if (!bVar5) {
          local_3b0._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_3b0,"CMAKE_CACHEFILE_DIR","");
          cVar11 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                   ::find(&this_00->_M_t,(key_type *)local_3b0);
          if ((_Rb_tree_header *)cVar11._M_node == p_Var1) {
            p_Var15 = (_Base_ptr)0x0;
          }
          else {
            p_Var15 = (_Base_ptr)0x0;
            if (*(char *)&cVar11._M_node[4]._M_right != '\0') {
              p_Var15 = cVar11._M_node + 2;
            }
          }
          if ((pointer)local_3b0._0_8_ != pcVar3) {
            operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_3b0,"The current CMakeCache.txt directory ",0x25);
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b0,local_4a0.Value._M_dataplus._M_p,
                               local_4a0.Value._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12," is different than the directory ",0x21);
          paVar2 = &local_4d0.field_2;
          local_4d0._M_dataplus._M_p = (pointer)paVar2;
          if (p_Var15 == (_Base_ptr)0x0) {
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"");
          }
          else {
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4d0,*(long *)p_Var15,
                       (long)&p_Var15->_M_parent->_M_color + *(long *)p_Var15);
          }
          poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar12,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar12,
                     " where CMakeCache.txt was created. This may result in binaries being created in the wrong place. If you are not sure, reedit the CMakeCache.txt"
                     ,0x8f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_4d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != paVar2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
          std::ios_base::~ios_base(local_340);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,
                          CONCAT71(local_4f0.field_2._M_allocated_capacity._1_7_,
                                   local_4f0.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4a0.Value._M_dataplus._M_p != paVar14) {
          operator_delete(local_4a0.Value._M_dataplus._M_p,
                          CONCAT71(local_4a0.Value.field_2._M_allocated_capacity._1_7_,
                                   local_4a0.Value.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p,
                        CONCAT71(local_440.field_2._M_allocated_capacity._1_7_,
                                 local_440.field_2._M_local_buf[0]) + 1);
      }
      uVar7 = (ulong)local_4a4;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._32_8_ != &local_3d8) {
        operator_delete((void *)local_408._32_8_,
                        CONCAT71(local_3d8._M_allocated_capacity._1_7_,local_3d8._M_local_buf[0]) +
                        1);
      }
    }
    uVar13 = (undefined1)uVar7;
    std::ifstream::~ifstream(local_238);
  }
  else {
    CleanCMakeFiles(pcVar16,path);
    uVar13 = 0;
  }
  if ((undefined1 *)local_408._0_8_ != local_408 + 0x10) {
    operator_delete((void *)local_408._0_8_,local_408._16_8_ + 1);
  }
  return (bool)uVar13;
  while( true ) {
    if ((*(byte *)((long)paVar14 + 2) == 0x5c) && (*(byte *)((long)paVar14 + 3) == 0x6e)) {
      std::__cxx11::string::append((char *)&local_4f0);
    }
    std::__cxx11::string::append((char *)&local_4f0);
    cmsys::SystemTools::GetLineFromStream
              ((istream *)local_238,(string *)(local_408 + 0x20),(bool *)0x0,-1);
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._32_8_;
    if (*(byte *)local_408._32_8_ != 0x2f) break;
LAB_0025fddc:
    if (*(byte *)((long)paVar14 + 1) != 0x2f) break;
  }
LAB_0025fe42:
  local_3b0._0_8_ = local_3b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"HELPSTRING","");
  CacheEntry::SetProperty(&local_4a0,(string *)local_3b0,local_4f0._M_dataplus._M_p);
  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  local_3b0._0_8_ = local_3b0 + 0x10;
  sVar8 = strlen(paVar14->_M_local_buf);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3b0,paVar14,(byte *)((long)paVar14 + sVar8));
  bVar5 = cmState::ParseCacheEntry((string *)local_3b0,&local_440,&local_4a0.Value,&local_4a0.Type);
  if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  if (bVar5) {
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(local_410,&local_440);
    if ((iVar9._M_node == local_3b8) &&
       (((internal || (local_4a0.Type != INTERNAL)) ||
        (iVar9 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::find(local_420,&local_440), iVar9._M_node != local_3c0)))) {
      if (!internal) {
        local_4a0.Type = INTERNAL;
        std::__cxx11::string::_M_replace
                  ((ulong)&local_4f0,0,(char *)local_4f0._M_string_length,0x4b9d7d);
        std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)local_440._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&local_4f0);
        std::__cxx11::string::_M_append((char *)&local_4f0,(ulong)(local_418->_M_dataplus)._M_p);
        std::__cxx11::string::append((char *)&local_4f0);
        local_3b0._0_8_ = local_3b0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"HELPSTRING","");
        CacheEntry::SetProperty(&local_4a0,(string *)local_3b0,local_4f0._M_dataplus._M_p);
        if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
          operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
        }
      }
      bVar5 = ReadPropertyEntry(local_4b0,&local_440,&local_4a0);
      if (!bVar5) {
        local_4a0.Initialized = true;
        pmVar10 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCacheManager::CacheEntry>_>_>
                  ::operator[](local_3c8,&local_440);
        std::__cxx11::string::_M_assign((string *)pmVar10);
        pmVar10->Type = local_4a0.Type;
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
        ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                     *)&pmVar10->Properties,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                     *)&local_4a0.Properties);
        pmVar10->Initialized = local_4a0.Initialized;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,"Parse error in cache file ",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_3b0,(char *)local_408._0_8_,local_408._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3b0," on line ",9);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)local_3b0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,". Offending entry: ",0x13);
    sVar8 = strlen(paVar14->_M_local_buf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,paVar14->_M_local_buf,sVar8);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_4d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
      operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    std::ios_base::~ios_base(local_340);
  }
LAB_0026019e:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
               *)&local_4a0.Properties);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a0.Value._M_dataplus._M_p != &local_4a0.Value.field_2) {
    operator_delete(local_4a0.Value._M_dataplus._M_p,
                    CONCAT71(local_4a0.Value.field_2._M_allocated_capacity._1_7_,
                             local_4a0.Value.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,
                    CONCAT71(local_4f0.field_2._M_allocated_capacity._1_7_,
                             local_4f0.field_2._M_local_buf[0]) + 1);
  }
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) goto LAB_002601fd;
  goto LAB_0025fd0d;
}

Assistant:

bool cmCacheManager::LoadCache(const std::string& path, bool internal,
                               std::set<std::string>& excludes,
                               std::set<std::string>& includes)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  // clear the old cache, if we are reading in internal values
  if (internal) {
    this->Cache.clear();
  }
  if (!cmSystemTools::FileExists(cacheFile)) {
    this->CleanCMakeFiles(path);
    return false;
  }

  cmsys::ifstream fin(cacheFile.c_str());
  if (!fin) {
    return false;
  }
  const char* realbuffer;
  std::string buffer;
  std::string entryKey;
  unsigned int lineno = 0;
  while (fin) {
    // Format is key:type=value
    std::string helpString;
    CacheEntry e;
    cmSystemTools::GetLineFromStream(fin, buffer);
    lineno++;
    realbuffer = buffer.c_str();
    while (*realbuffer != '0' &&
           (*realbuffer == ' ' || *realbuffer == '\t' || *realbuffer == '\r' ||
            *realbuffer == '\n')) {
      if (*realbuffer == '\n') {
        lineno++;
      }
      realbuffer++;
    }
    // skip blank lines and comment lines
    if (realbuffer[0] == '#' || realbuffer[0] == 0) {
      continue;
    }
    while (realbuffer[0] == '/' && realbuffer[1] == '/') {
      if ((realbuffer[2] == '\\') && (realbuffer[3] == 'n')) {
        helpString += "\n";
        helpString += &realbuffer[4];
      } else {
        helpString += &realbuffer[2];
      }
      cmSystemTools::GetLineFromStream(fin, buffer);
      lineno++;
      realbuffer = buffer.c_str();
      if (!fin) {
        continue;
      }
    }
    e.SetProperty("HELPSTRING", helpString.c_str());
    if (cmState::ParseCacheEntry(realbuffer, entryKey, e.Value, e.Type)) {
      if (excludes.find(entryKey) == excludes.end()) {
        // Load internal values if internal is set.
        // If the entry is not internal to the cache being loaded
        // or if it is in the list of internal entries to be
        // imported, load it.
        if (internal || (e.Type != cmStateEnums::INTERNAL) ||
            (includes.find(entryKey) != includes.end())) {
          // If we are loading the cache from another project,
          // make all loaded entries internal so that it is
          // not visible in the gui
          if (!internal) {
            e.Type = cmStateEnums::INTERNAL;
            helpString = "DO NOT EDIT, ";
            helpString += entryKey;
            helpString += " loaded from external file.  "
                          "To change this value edit this file: ";
            helpString += path;
            helpString += "/CMakeCache.txt";
            e.SetProperty("HELPSTRING", helpString.c_str());
          }
          if (!this->ReadPropertyEntry(entryKey, e)) {
            e.Initialized = true;
            this->Cache[entryKey] = e;
          }
        }
      }
    } else {
      std::ostringstream error;
      error << "Parse error in cache file " << cacheFile;
      error << " on line " << lineno << ". Offending entry: " << realbuffer;
      cmSystemTools::Error(error.str());
    }
  }
  this->CacheMajorVersion = 0;
  this->CacheMinorVersion = 0;
  if (const std::string* cmajor =
        this->GetInitializedCacheValue("CMAKE_CACHE_MAJOR_VERSION")) {
    unsigned int v = 0;
    if (sscanf(cmajor->c_str(), "%u", &v) == 1) {
      this->CacheMajorVersion = v;
    }
    if (const std::string* cminor =
          this->GetInitializedCacheValue("CMAKE_CACHE_MINOR_VERSION")) {
      if (sscanf(cminor->c_str(), "%u", &v) == 1) {
        this->CacheMinorVersion = v;
      }
    }
  } else {
    // CMake version not found in the list file.
    // Set as version 0.0
    this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION", "0",
                        "Minor version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION", "0",
                        "Major version of cmake used to create the "
                        "current loaded cache",
                        cmStateEnums::INTERNAL);
  }
  // check to make sure the cache directory has not
  // been moved
  const std::string* oldDir =
    this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
  if (internal && oldDir) {
    std::string currentcwd = path;
    std::string oldcwd = *oldDir;
    cmSystemTools::ConvertToUnixSlashes(currentcwd);
    currentcwd += "/CMakeCache.txt";
    oldcwd += "/CMakeCache.txt";
    if (!cmSystemTools::SameFile(oldcwd, currentcwd)) {
      const std::string* dir =
        this->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR");
      std::ostringstream message;
      message << "The current CMakeCache.txt directory " << currentcwd
              << " is different than the directory " << (dir ? *dir : "")
              << " where CMakeCache.txt was created. This may result "
                 "in binaries being created in the wrong place. If you "
                 "are not sure, reedit the CMakeCache.txt";
      cmSystemTools::Error(message.str());
    }
  }
  return true;
}